

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O2

void anon_unknown.dwarf_2c2adb::fillPixelsColor(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  half *this;
  half *this_00;
  ulong uVar5;
  half *this_01;
  long lVar6;
  int x;
  ulong uVar7;
  float f;
  double dVar8;
  double dVar9;
  double dVar10;
  long local_78;
  
  uVar5 = (ulong)(uint)w;
  if (w < 1) {
    uVar5 = 0;
  }
  local_78 = 0;
  uVar3 = (ulong)(uint)h;
  if (h < 1) {
    uVar3 = 0;
  }
  for (uVar2 = 0; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    dVar8 = (double)(int)uVar2;
    lVar6 = 6;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      lVar4 = pixels->_sizeY * local_78;
      pRVar1 = pixels->_data;
      this_01 = (half *)((long)pRVar1 + lVar6 + lVar4 + -6);
      dVar9 = (double)(int)uVar7 * 0.05;
      dVar10 = sin(dVar9);
      Imath_3_2::half::operator=(this_01,(float)(dVar10 * 0.5 + 0.8));
      dVar10 = sin((double)(int)uVar7 * 0.02 + dVar8 * 0.02);
      this_00 = (half *)((long)pRVar1 + lVar6 + lVar4 + -4);
      Imath_3_2::half::operator=(this_00,(float)(dVar10 * 0.5 + 0.8));
      dVar10 = sin(dVar8 * 0.03);
      this = (half *)((long)pRVar1 + lVar6 + lVar4 + -2);
      Imath_3_2::half::operator=(this,(float)(dVar10 * 0.5 + 0.8));
      dVar9 = sin(dVar9 + dVar8 * -0.05);
      f = (float)(dVar9 * 0.5 + 0.8);
      Imath_3_2::half::operator*=(this_01,f);
      Imath_3_2::half::operator*=(this_00,f);
      Imath_3_2::half::operator*=(this,f);
      Imath_3_2::half::operator=((half *)((long)&(pRVar1->r)._h + lVar6 + lVar4),f);
      lVar6 = lVar6 + 8;
    }
    local_78 = local_78 + 8;
  }
  return;
}

Assistant:

void
fillPixelsColor (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = 0.8 + 0.5 * sin (x * 0.05);
            p.g = 0.8 + 0.5 * sin (x * 0.02 + y * 0.02);
            p.b = 0.8 + 0.5 * sin (y * 0.03);

            float t = 0.8 + 0.5 * sin (x * 0.05 - y * 0.05);

            p.r *= t;
            p.g *= t;
            p.b *= t;
            p.a = t;
        }
    }
}